

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_container.cpp
# Opt level: O0

unsigned_long __thiscall
midi_container::get_timestamp_end(midi_container *this,unsigned_long subsong,bool ms)

{
  const_reference pvVar1;
  midi_container *local_38;
  unsigned_long timestamp;
  unsigned_long tempo_track;
  bool ms_local;
  unsigned_long subsong_local;
  midi_container *this_local;
  
  timestamp = 0;
  pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     (&this->m_timestamp_end,0);
  local_38 = (midi_container *)*pvVar1;
  if ((this->m_form == 2) && (subsong != 0)) {
    pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->m_timestamp_end,subsong);
    local_38 = (midi_container *)*pvVar1;
    timestamp = subsong;
  }
  if (ms) {
    this_local = (midi_container *)timestamp_to_ms(this,(unsigned_long)local_38,timestamp);
  }
  else {
    this_local = local_38;
  }
  return (unsigned_long)this_local;
}

Assistant:

unsigned long midi_container::get_timestamp_end(unsigned long subsong, bool ms /* = false */) const
{
    unsigned long tempo_track = 0;
    unsigned long timestamp = m_timestamp_end[ 0 ];
    if ( m_form == 2 && subsong )
    {
        tempo_track = subsong;
        timestamp = m_timestamp_end[ subsong ];
    }
    if ( !ms ) return timestamp;
    else return timestamp_to_ms( timestamp, tempo_track );
}